

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

Vector<int,_std::allocator<int>_> * __thiscall
NavierStokesBase::fetchBCArray
          (Vector<int,_std::allocator<int>_> *__return_storage_ptr__,NavierStokesBase *this,
          int State_Type,Box *bx,int scomp,int ncomp)

{
  pointer piVar1;
  BCRec *pBVar2;
  long lVar3;
  undefined4 uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined4 uVar7;
  ulong uVar8;
  int *bxlo;
  BCRec bcr;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  std::vector<int,_std::allocator<int>_>::vector
            (&__return_storage_ptr__->super_vector<int,_std::allocator<int>_>,(long)(ncomp * 6),
             (allocator_type *)&local_48);
  local_48 = 0xfffffd66fffffd66;
  uStack_40 = 0xfffffd66fffffd66;
  local_38 = 0xfffffd66fffffd66;
  uVar6 = 0;
  uVar5 = (ulong)(uint)ncomp;
  if (ncomp < 1) {
    uVar5 = uVar6;
  }
  for (uVar8 = 0; uVar8 != uVar5; uVar8 = uVar8 + 1) {
    pBVar2 = amrex::StateDescriptor::getBC
                       ((this->super_AmrLevel).state.
                        super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                        super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                        _M_impl.super__Vector_impl_data._M_start[State_Type].desc,(int)uVar8 + scomp
                       );
    for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 4) {
      uVar4 = 0;
      uVar7 = 0;
      if (*(int *)((long)(bx->smallend).vect + lVar3) <=
          *(int *)((long)(this->super_AmrLevel).geom.domain.smallend.vect + lVar3)) {
        uVar7 = *(undefined4 *)((long)pBVar2->bc + lVar3);
      }
      *(undefined4 *)((long)&local_48 + lVar3) = uVar7;
      if (*(int *)((long)(this->super_AmrLevel).geom.domain.bigend.vect + lVar3) <=
          *(int *)((long)(bx->bigend).vect + lVar3)) {
        uVar4 = *(undefined4 *)((long)pBVar2->bc + lVar3 + 0xc);
      }
      *(undefined4 *)((long)&uStack_40 + lVar3 + 4) = uVar4;
    }
    piVar1 = (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
      *(undefined4 *)((long)piVar1 + lVar3 * 4 + uVar6) =
           *(undefined4 *)((long)&local_48 + lVar3 * 4);
    }
    uVar6 = uVar6 + 0x18;
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<int>
NavierStokesBase::fetchBCArray (int State_Type, const Box& bx, int scomp, int ncomp)
{
    Vector<int> bc(2*AMREX_SPACEDIM*ncomp);
    BCRec bcr;
    const StateDescriptor* stDesc;
    const Box& domain = geom.Domain();

    for (int n = 0; n < ncomp; n++)
    {
        stDesc=state[State_Type].descriptor();
        setBC(bx,domain,stDesc->getBC(scomp+n),bcr);

        const int* b_rec = bcr.vect();
        for (int m = 0; m < 2*AMREX_SPACEDIM; m++) {
            bc[2*AMREX_SPACEDIM*n + m] = b_rec[m];
        }
    }

    return bc;
}